

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.cpp
# Opt level: O0

void __thiscall
phaeton::ExpressionNode::ExpressionNode
          (ExpressionNode *this,ExprKind Kind,int NumChildren,ExprDims *ED)

{
  int iVar1;
  int iVar2;
  value_type local_38;
  int local_30;
  int I;
  vector<int,_std::allocator<int>_> *local_20;
  ExprDims *ED_local;
  int NumChildren_local;
  ExprKind Kind_local;
  ExpressionNode *this_local;
  
  this->_vptr_ExpressionNode = (_func_int **)&PTR__ExpressionNode_001f9598;
  this->ExKind = Kind;
  this->NumChildren = NumChildren;
  local_20 = ED;
  ED_local._0_4_ = NumChildren;
  ED_local._4_4_ = Kind;
  _NumChildren_local = this;
  std::vector<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>::vector
            (&this->Children);
  std::vector<int,_std::allocator<int>_>::vector(&this->Dims,local_20);
  local_30 = 0;
  while( true ) {
    iVar1 = local_30;
    iVar2 = getNumChildren(this);
    if (iVar2 <= iVar1) break;
    local_38 = (value_type)0x0;
    std::vector<phaeton::ExpressionNode_*,_std::allocator<phaeton::ExpressionNode_*>_>::push_back
              (&this->Children,&local_38);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

ExpressionNode::ExpressionNode(ExprKind Kind, int NumChildren,
                               const ExprDims &ED)
    : ExKind(Kind), NumChildren(NumChildren), Dims(ED) {
  for (int I = 0; I < getNumChildren(); ++I) {
    Children.push_back(nullptr);
  }
}